

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

AssertionResult
testing::(anonymous_namespace)::IsSubstringImpl<wchar_t_const*>
          (bool expected_to_be_substring,char *needle_expr,char *haystack_expr,wchar_t **needle,
          wchar_t **haystack)

{
  bool bVar1;
  AssertionResult *this;
  AssertionResult *other;
  AssertionResult *this_00;
  AssertionResult *value;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  byte in_SIL;
  undefined8 in_RDI;
  AssertionResult AVar3;
  char *begin_string_quote;
  bool is_wide_string;
  wchar_t *in_stack_fffffffffffffef8;
  char (*in_stack_ffffffffffffff28) [16];
  AssertionResult *in_stack_ffffffffffffff30;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var2;
  
  bVar1 = anon_unknown_36::IsSubstringPred(in_stack_fffffffffffffef8,(wchar_t *)0x169c79);
  if (bVar1 == (bool)(in_SIL & 1)) {
    AVar3 = AssertionSuccess();
    _Var2._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )AVar3.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  }
  else {
    AssertionFailure();
    AssertionResult::operator<<(in_stack_ffffffffffffff30,(char (*) [11])in_stack_ffffffffffffff28);
    AssertionResult::operator<<(in_stack_ffffffffffffff30,(char **)in_stack_ffffffffffffff28);
    AssertionResult::operator<<(in_stack_ffffffffffffff30,(char (*) [2])in_stack_ffffffffffffff28);
    AssertionResult::operator<<(in_stack_ffffffffffffff30,(char (*) [11])in_stack_ffffffffffffff28);
    AssertionResult::operator<<(in_stack_ffffffffffffff30,(char **)in_stack_ffffffffffffff28);
    AssertionResult::operator<<(in_stack_ffffffffffffff30,(wchar_t **)in_stack_ffffffffffffff28);
    AssertionResult::operator<<(in_stack_ffffffffffffff30,(char (*) [3])in_stack_ffffffffffffff28);
    this = AssertionResult::operator<<
                     (in_stack_ffffffffffffff30,(char (*) [11])in_stack_ffffffffffffff28);
    other = AssertionResult::operator<<
                      (in_stack_ffffffffffffff30,(char **)in_stack_ffffffffffffff28);
    this_00 = AssertionResult::operator<<(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    value = AssertionResult::operator<<(this_00,(char **)in_stack_ffffffffffffff28);
    AssertionResult::operator<<(this_00,&value->success_);
    AssertionResult::operator<<(this_00,&value->success_);
    AssertionResult::operator<<(this_00,(char **)value);
    AssertionResult::operator<<(this_00,(wchar_t **)value);
    AssertionResult::operator<<(this_00,&value->success_);
    AssertionResult::AssertionResult(this,other);
    AssertionResult::~AssertionResult((AssertionResult *)0x169ea2);
    _Var2._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         extraout_RDX._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  AVar3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )_Var2._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  AVar3._0_8_ = in_RDI;
  return AVar3;
}

Assistant:

AssertionResult IsSubstringImpl(
    bool expected_to_be_substring,
    const char* needle_expr, const char* haystack_expr,
    const StringType& needle, const StringType& haystack) {
  if (IsSubstringPred(needle, haystack) == expected_to_be_substring)
    return AssertionSuccess();

  const bool is_wide_string = sizeof(needle[0]) > 1;
  const char* const begin_string_quote = is_wide_string ? "L\"" : "\"";
  return AssertionFailure()
      << "Value of: " << needle_expr << "\n"
      << "  Actual: " << begin_string_quote << needle << "\"\n"
      << "Expected: " << (expected_to_be_substring ? "" : "not ")
      << "a substring of " << haystack_expr << "\n"
      << "Which is: " << begin_string_quote << haystack << "\"";
}